

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O2

void __thiscall
QPDFPageObjectHelper::parseContents(QPDFPageObjectHelper *this,ParserCallbacks *callbacks)

{
  bool bVar1;
  BaseHandle *pBVar2;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  pBVar2 = &(this->super_QPDFObjectHelper).super_BaseHandle;
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_30,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar2);
  bVar1 = QPDFObjectHandle::isFormXObject((QPDFObjectHandle *)&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  if (bVar1) {
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_30,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar2);
    QPDFObjectHandle::parseAsContents((QPDFObjectHandle *)&local_30,callbacks);
  }
  else {
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_30,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar2);
    QPDFObjectHandle::parsePageContents((QPDFObjectHandle *)&local_30,callbacks);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  return;
}

Assistant:

void
QPDFPageObjectHelper::parseContents(QPDFObjectHandle::ParserCallbacks* callbacks)
{
    if (oh().isFormXObject()) {
        oh().parseAsContents(callbacks);
    } else {
        oh().parsePageContents(callbacks);
    }
}